

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cidr.c++
# Opt level: O0

String * __thiscall kj::CidrRange::toString(String *__return_storage_ptr__,CidrRange *this)

{
  bool bVar1;
  uint *in_R8;
  char local_e5 [13];
  Fault local_d8;
  Fault f;
  char *local_c8;
  undefined1 local_c0 [8];
  DebugComparison<const_char_*,_char_(&)[128]> _kjCondition;
  char result [128];
  CidrRange *this_local;
  
  memset(&_kjCondition.result,0,0x80);
  f.exception = (Exception *)inet_ntop(this->family,this->bits,&_kjCondition.result,0x80);
  local_c8 = (char *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,(char **)&f);
  kj::_::DebugExpression<char_const*>::operator==
            ((DebugComparison<const_char_*,_char_(&)[128]> *)local_c0,
             (DebugExpression<char_const*> *)&local_c8,(char (*) [128])&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_c0);
  if (!bVar1) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<char_const*,char(&)[128]>&>
              (&local_d8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/cidr.c++"
               ,0xa4,FAILED,"inet_ntop(family, (void*)bits, result, sizeof(result)) == result",
               "_kjCondition,",(DebugComparison<const_char_*,_char_(&)[128]> *)local_c0);
    kj::_::Debug::Fault::fatal(&local_d8);
  }
  local_e5[0] = '/';
  str<char(&)[128],char,unsigned_int_const&>
            (__return_storage_ptr__,(kj *)&_kjCondition.result,(char (*) [128])local_e5,
             (char *)&this->bitCount,in_R8);
  return __return_storage_ptr__;
}

Assistant:

String CidrRange::toString() const {
  char result[128]{};
  KJ_ASSERT(inet_ntop(family, (void*)bits, result, sizeof(result)) == result);
  return kj::str(result, '/', bitCount);
}